

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O3

Abc_Des_t * Abc_DesDupBlackboxes(Abc_Des_t *p,Abc_Ntk_t *pNtkSave)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Des_t *pAVar4;
  void **ppvVar5;
  Abc_Ntk_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  if (p->vTops->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vTops) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                  ,0xaa,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
  }
  if (1 < p->vModules->nSize) {
    pAVar4 = Abc_DesCreate(p->pName);
    pVVar7 = pAVar4->vTops;
    uVar1 = pVVar7->nSize;
    if (uVar1 == pVVar7->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
        }
        pVVar7->pArray = ppvVar5;
        pVVar7->nCap = 0x10;
      }
      else {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
        }
        pVVar7->pArray = ppvVar5;
        pVVar7->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar5 = pVVar7->pArray;
    }
    iVar2 = pVVar7->nSize;
    pVVar7->nSize = iVar2 + 1;
    ppvVar5[iVar2] = pNtkSave;
    pVVar7 = pAVar4->vModules;
    uVar1 = pVVar7->nSize;
    if (uVar1 == pVVar7->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc(0x80);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,0x80);
        }
        pVVar7->pArray = ppvVar5;
        pVVar7->nCap = 0x10;
      }
      else {
        if (pVVar7->pArray == (void **)0x0) {
          ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar5 = (void **)realloc(pVVar7->pArray,(ulong)uVar1 << 4);
        }
        pVVar7->pArray = ppvVar5;
        pVVar7->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar5 = pVVar7->pArray;
    }
    iVar2 = pVVar7->nSize;
    pVVar7->nSize = iVar2 + 1;
    ppvVar5[iVar2] = pNtkSave;
    pVVar7 = p->vModules;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        if (((Abc_Ntk_t *)pVVar7->pArray[lVar8])->ntkFunc == ABC_FUNC_BLACKBOX) {
          pVVar3 = pAVar4->vModules;
          pAVar6 = Abc_NtkDup((Abc_Ntk_t *)pVVar7->pArray[lVar8]);
          uVar1 = pVVar3->nSize;
          if (uVar1 == pVVar3->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
              }
              pVVar3->pArray = ppvVar5;
              pVVar3->nCap = 0x10;
            }
            else {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
              }
              pVVar3->pArray = ppvVar5;
              pVVar3->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar5 = pVVar3->pArray;
          }
          iVar2 = pVVar3->nSize;
          pVVar3->nSize = iVar2 + 1;
          ppvVar5[iVar2] = pAVar6;
          pVVar7 = p->vModules;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar7->nSize);
    }
    return pAVar4;
  }
  __assert_fail("Vec_PtrSize(p->vModules) > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLib.c"
                ,0xab,"Abc_Des_t *Abc_DesDupBlackboxes(Abc_Des_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave )
{
    Abc_Des_t * pNew;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Vec_PtrSize(p->vTops) > 0 );
    assert( Vec_PtrSize(p->vModules) > 1 );
    pNew = Abc_DesCreate( p->pName );
//    pNew->pManFunc = pNtkSave->pManFunc;
    Vec_PtrPush( pNew->vTops, pNtkSave );
    Vec_PtrPush( pNew->vModules, pNtkSave );
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pNtkTemp, i )
        if ( Abc_NtkHasBlackbox( pNtkTemp ) )
            Vec_PtrPush( pNew->vModules, Abc_NtkDup(pNtkTemp) );
    return pNew;
}